

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
visitor_test_should_visit_snapshot_frame_Test::visitor_test_should_visit_snapshot_frame_Test
          (visitor_test_should_visit_snapshot_frame_Test *this)

{
  visitor_test_should_visit_snapshot_frame_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__visitor_test_should_visit_snapshot_frame_Test_017a2678;
  return;
}

Assistant:

TEST(visitor_test, should_visit_snapshot_frame)
{
    const char* frame = "8=FIX.4.4|9=0230|35=W|49=Prov|56=MDABC|34=2289004|52=20161229-16:18:09.098|55=AUD/CAD|262=1709|268=2|"
                        "269=0|270=0.97285|271=500000|272=20170103|299=02z00000hdi:A|9063=MP|"
                        "269=1|270=0.97309|271=500000|272=20170103|299=02z00000hdi:A|9063=TP|"
                        "10=233|";

    using Visitor = should_visit_custom_snapshot_frame::Visitor;
    using VisitRules = should_visit_custom_snapshot_frame::VisitRules;

   auto err = doVisit(frame, Visitor(), VisitRules());
   ASSERT_TRUE(err.isOk());
}